

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_nonce_function_musig
               (secp256k1_scalar *k,uchar *session_secrand,uchar *msg32,uchar *seckey32,uchar *pk33,
               uchar *agg_pk32,uchar *extra_input32)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  secp256k1_sha256 *psVar9;
  secp256k1_sha256 *psVar10;
  byte bVar11;
  uchar msg_present;
  unsigned_long _zzq_args [6];
  uchar rand [32];
  secp256k1_sha256 sha_tmp;
  uchar buf [32];
  uchar local_192;
  uchar local_191 [17];
  secp256k1_sha256 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  secp256k1_sha256 local_138;
  secp256k1_sha256 local_c8;
  uchar local_58 [40];
  
  bVar11 = 0;
  if (seckey32 == (uchar *)0x0) {
    local_158 = *(undefined8 *)session_secrand;
    uStack_150 = *(undefined8 *)(session_secrand + 8);
    local_148 = *(undefined8 *)(session_secrand + 0x10);
    uStack_140 = *(undefined8 *)(session_secrand + 0x18);
  }
  else {
    local_138.s[0] = 0xa19e884b;
    local_138.s[1] = 0xf463fe7e;
    local_138.s[2] = 0x2f18f9a2;
    local_138.s[3] = 0xbeb0f9ff;
    local_138.s[4] = 0xf37e8b0;
    local_138.s[5] = 0x6ebd26f;
    local_138.s[6] = 0xe3b243d2;
    local_138.s[7] = 0x522fb150;
    local_138.bytes = 0x40;
    secp256k1_sha256_write(&local_138,session_secrand,0x20);
    secp256k1_sha256_finalize(&local_138,(uchar *)&local_158);
    lVar7 = 0;
    do {
      puVar1 = (uint *)(seckey32 + lVar7);
      uVar2 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      uVar5 = *(uint *)((long)&uStack_150 + lVar7);
      uVar6 = *(uint *)((long)&uStack_150 + lVar7 + 4);
      *(uint *)((long)&local_158 + lVar7) = *puVar1 ^ *(uint *)((long)&local_158 + lVar7);
      *(uint *)((long)&local_158 + lVar7 + 4) = uVar2 ^ *(uint *)((long)&local_158 + lVar7 + 4);
      *(uint *)((long)&uStack_150 + lVar7) = uVar3 ^ uVar5;
      *(uint *)((long)&uStack_150 + lVar7 + 4) = uVar4 ^ uVar6;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    local_192 = ' ';
  }
  local_138.s[0] = 0x7101b64;
  local_138.s[1] = 0x18003414;
  local_138.s[2] = 0x391bc43;
  local_138.s[3] = 0xe6258ee;
  local_138.s[4] = 0x29d26b72;
  local_138.s[5] = 0x8343937e;
  local_138.s[6] = 0xb7a0a4fb;
  local_138.s[7] = 0xff568a30;
  local_138.bytes = 0x40;
  secp256k1_sha256_write(&local_138,(uchar *)&local_158,0x20);
  secp256k1_nonce_function_musig_helper(&local_138,1,pk33,'!');
  secp256k1_nonce_function_musig_helper(&local_138,1,agg_pk32,' ');
  local_191[0] = msg32 != (uchar *)0x0;
  secp256k1_sha256_write(&local_138,local_191,1);
  if (msg32 != (uchar *)0x0) {
    secp256k1_nonce_function_musig_helper(&local_138,8,msg32,' ');
  }
  secp256k1_nonce_function_musig_helper(&local_138,4,extra_input32,' ');
  local_192 = '\0';
  lVar7 = -1;
  do {
    psVar9 = &local_138;
    psVar10 = &local_c8;
    for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)psVar10->s = *(undefined8 *)psVar9->s;
      psVar9 = (secp256k1_sha256 *)((long)psVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      psVar10 = (secp256k1_sha256 *)((long)psVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    secp256k1_sha256_write(&local_c8,&local_192,1);
    secp256k1_sha256_finalize(&local_c8,local_58);
    secp256k1_scalar_set_b32(k,local_58,(int *)0x0);
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_c8.s[0] = 0;
    local_c8.s[1] = 0;
    local_c8.s[2] = 0;
    local_c8.s[3] = 0;
    local_c8.s[4] = 0;
    local_c8.s[5] = 0;
    local_c8.s[6] = 0;
    local_c8.s[7] = 0;
    local_c8.buf[0] = '\0';
    local_c8.buf[1] = '\0';
    local_c8.buf[2] = '\0';
    local_c8.buf[3] = '\0';
    local_c8.buf[4] = '\0';
    local_c8.buf[5] = '\0';
    local_c8.buf[6] = '\0';
    local_c8.buf[7] = '\0';
    local_c8.buf[8] = '\0';
    local_c8.buf[9] = '\0';
    local_c8.buf[10] = '\0';
    local_c8.buf[0xb] = '\0';
    local_c8.buf[0xc] = '\0';
    local_c8.buf[0xd] = '\0';
    local_c8.buf[0xe] = '\0';
    local_c8.buf[0xf] = '\0';
    local_c8.buf[0x10] = '\0';
    local_c8.buf[0x11] = '\0';
    local_c8.buf[0x12] = '\0';
    local_c8.buf[0x13] = '\0';
    local_c8.buf[0x14] = '\0';
    local_c8.buf[0x15] = '\0';
    local_c8.buf[0x16] = '\0';
    local_c8.buf[0x17] = '\0';
    local_c8.buf[0x18] = '\0';
    local_c8.buf[0x19] = '\0';
    local_c8.buf[0x1a] = '\0';
    local_c8.buf[0x1b] = '\0';
    local_c8.buf[0x1c] = '\0';
    local_c8.buf[0x1d] = '\0';
    local_c8.buf[0x1e] = '\0';
    local_c8.buf[0x1f] = '\0';
    local_c8.buf[0x20] = '\0';
    local_c8.buf[0x21] = '\0';
    local_c8.buf[0x22] = '\0';
    local_c8.buf[0x23] = '\0';
    local_c8.buf[0x24] = '\0';
    local_c8.buf[0x25] = '\0';
    local_c8.buf[0x26] = '\0';
    local_c8.buf[0x27] = '\0';
    local_c8.buf[0x28] = '\0';
    local_c8.buf[0x29] = '\0';
    local_c8.buf[0x2a] = '\0';
    local_c8.buf[0x2b] = '\0';
    local_c8.buf[0x2c] = '\0';
    local_c8.buf[0x2d] = '\0';
    local_c8.buf[0x2e] = '\0';
    local_c8.buf[0x2f] = '\0';
    local_c8.buf[0x30] = '\0';
    local_c8.buf[0x31] = '\0';
    local_c8.buf[0x32] = '\0';
    local_c8.buf[0x33] = '\0';
    local_c8.buf[0x34] = '\0';
    local_c8.buf[0x35] = '\0';
    local_c8.buf[0x36] = '\0';
    local_c8.buf[0x37] = '\0';
    local_c8.buf[0x38] = '\0';
    local_c8.buf[0x39] = '\0';
    local_c8.buf[0x3a] = '\0';
    local_c8.buf[0x3b] = '\0';
    local_c8.buf[0x3c] = '\0';
    local_c8.buf[0x3d] = '\0';
    local_c8.buf[0x3e] = '\0';
    local_c8.buf[0x3f] = '\0';
    local_c8.bytes = 0;
    local_191[9] = '\x01';
    local_191[10] = '\0';
    local_191[0xb] = 'C';
    local_191[0xc] = 'M';
    local_191[0xd] = '\0';
    local_191[0xe] = '\0';
    local_191[0xf] = '\0';
    local_191[0x10] = '\0';
    local_178 = 0x68;
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    local_191[1] = '\0';
    local_191[2] = '\0';
    local_191[3] = '\0';
    local_191[4] = '\0';
    local_191[5] = '\0';
    local_191[6] = '\0';
    local_191[7] = '\0';
    local_191[8] = '\0';
    local_192 = (char)lVar7 + '\x02';
    k = k + 1;
    lVar7 = lVar7 + 1;
    local_180 = &local_c8;
  } while (lVar7 == 0);
  return;
}

Assistant:

static void secp256k1_nonce_function_musig(secp256k1_scalar *k, const unsigned char *session_secrand, const unsigned char *msg32, const unsigned char *seckey32, const unsigned char *pk33, const unsigned char *agg_pk32, const unsigned char *extra_input32) {
    secp256k1_sha256 sha;
    unsigned char rand[32];
    unsigned char i;
    unsigned char msg_present;

    if (seckey32 != NULL) {
        secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, session_secrand, 32);
        secp256k1_sha256_finalize(&sha, rand);
        for (i = 0; i < 32; i++) {
            rand[i] ^= seckey32[i];
        }
    } else {
        memcpy(rand, session_secrand, sizeof(rand));
    }

    secp256k1_nonce_function_musig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand, sizeof(rand));
    secp256k1_nonce_function_musig_helper(&sha, 1, pk33, 33);
    secp256k1_nonce_function_musig_helper(&sha, 1, agg_pk32, 32);
    msg_present = msg32 != NULL;
    secp256k1_sha256_write(&sha, &msg_present, 1);
    if (msg_present) {
        secp256k1_nonce_function_musig_helper(&sha, 8, msg32, 32);
    }
    secp256k1_nonce_function_musig_helper(&sha, 4, extra_input32, 32);

    for (i = 0; i < 2; i++) {
        unsigned char buf[32];
        secp256k1_sha256 sha_tmp = sha;
        secp256k1_sha256_write(&sha_tmp, &i, 1);
        secp256k1_sha256_finalize(&sha_tmp, buf);
        secp256k1_scalar_set_b32(&k[i], buf, NULL);

        /* Attempt to erase secret data */
        secp256k1_memclear(buf, sizeof(buf));
        secp256k1_sha256_clear(&sha_tmp);
    }
    secp256k1_memclear(rand, sizeof(rand));
    secp256k1_sha256_clear(&sha);
}